

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int luaG_checkopenop(Instruction i)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((i & 0x3f) < 0x23) && ((0x470000000U >> (i & 0x3f) & 1) != 0)) {
    uVar1 = (uint)(i < 0x800000);
  }
  return uVar1;
}

Assistant:

int luaG_checkopenop (Instruction i) {
  switch (GET_OPCODE(i)) {
    case OP_CALL:
    case OP_TAILCALL:
    case OP_RETURN:
    case OP_SETLIST: {
      check(GETARG_B(i) == 0);
      return 1;
    }
    default: return 0;  /* invalid instruction after an open call */
  }
}